

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScanSSA.h
# Opt level: O0

Interval * __thiscall Interval::split(Interval *__return_storage_ptr__,Interval *this,int position)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  ASValue *v;
  int local_64;
  pair<int,_int> local_60;
  pair<int,_int> pair1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  iterator it;
  int position_local;
  Interval *this_local;
  Interval *P1;
  
  it._M_current._4_4_ = position;
  bVar2 = isFixed(this);
  if (bVar2) {
    __assert_fail("!isFixed() && \"Fixed interval is not splittable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/include/codegen/LinearScanSSA.h"
                  ,0x61,"Interval Interval::split(int)");
  }
  it._M_current._3_1_ = 0;
  Interval(__return_storage_ptr__);
  local_28._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 (&this->_intervals);
  while( true ) {
    local_30._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   (&this->_intervals);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_28);
    if ((ppVar3->first <= it._M_current._4_4_) &&
       (ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator->(&local_28), it._M_current._4_4_ <= ppVar3->second)) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_28);
      iVar1 = ppVar3->first;
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_28);
      if (iVar1 != ppVar3->second) goto LAB_002736b9;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_28);
  }
LAB_002737c3:
  v = getValue(this);
  setValue(__return_storage_ptr__,v);
  return __return_storage_ptr__;
LAB_002736b9:
  while( true ) {
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                       (&this->_intervals);
    iVar1 = pvVar4->first;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_28);
    if (iVar1 == ppVar3->first) break;
    local_40._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   (&__return_storage_ptr__->_intervals);
    __gnu_cxx::
    __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::__normal_iterator<std::pair<int,int>*>
              ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                *)&local_38,&local_40);
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                       (&this->_intervals);
    pair1 = (pair<int,_int>)
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                      (&__return_storage_ptr__->_intervals,local_38,pvVar4);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back
              (&this->_intervals);
  }
  ppVar3 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator->(&local_28);
  local_64 = it._M_current._4_4_ + -1;
  local_60 = std::make_pair<int&,int>(&ppVar3->first,&local_64);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back
            (&this->_intervals);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (&this->_intervals,&local_60);
  addRange(__return_storage_ptr__,it._M_current._4_4_,this->_end);
  this->_end = it._M_current._4_4_ + -1;
  goto LAB_002737c3;
}

Assistant:

Interval split(int position){
        assert(!isFixed() && "Fixed interval is not splittable");
        // if (position < 0) assert(0);
        // setSpill(position);
        Interval P1;
        for (auto it = _intervals.begin(); it != _intervals.end(); ++it){
            if (it->first <= position && it->second >= position && it->first!=it->second){
//                addRange(it->first,position-1);
//                addRange(position,it->second);
                while (_intervals.back().first != it->first){
                    P1._intervals.insert(P1._intervals.begin(),_intervals.back());
                    _intervals.pop_back();
                }
                auto pair1=std::make_pair(it->first,position-1);
                _intervals.pop_back();
                _intervals.push_back(pair1);
                P1.addRange(position,this->_end);
                this->_end=position-1;
                break;
            }
        }
        P1.setValue(getValue());
        // P1._begin=position;
//        while (this->_intervals.back().first >= position) this->_intervals.pop_back();
//        this->_end=position-1;
//        P1.setValue(getValue());
//        P1.setRegister(-1);
//        P1.setSpill(-1);
        return P1;
    }